

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstExpr.h
# Opt level: O2

void __thiscall nigel::AstExpr::~AstExpr(AstExpr *this)

{
  this->_vptr_AstExpr = (_func_int **)&PTR__AstExpr_00199630;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->token).super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<nigel::AstExpr>)._M_weak_this.
              super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

virtual ~AstExpr() {}